

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O1

int __thiscall XMISong::FindXMIDforms(XMISong *this,BYTE *chunk,int len,TrackInfo *songs)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  iVar4 = 0;
  if (0xb < len) {
    iVar4 = 0;
    iVar5 = 0;
    do {
      bVar1 = chunk[(long)iVar5 + 4];
      bVar2 = chunk[(long)iVar5 + 7];
      uVar6 = (uint)chunk[(long)iVar5 + 6] << 8 |
              (uint)(XMISong *)((ulong)chunk[(long)iVar5 + 5] << 0x10) | (uint)bVar1 << 0x18 |
              (uint)bVar2;
      if (*(int *)(chunk + iVar5) == 0x20544143) {
        iVar3 = FindXMIDforms(this,chunk + (long)iVar5 + 0xc,uVar6 - 4,songs + iVar4);
        iVar4 = iVar4 + iVar3;
      }
      else if ((*(int *)(chunk + iVar5) == 0x4d524f46) &&
              (*(int *)(chunk + (long)iVar5 + 8) == 0x44494d58)) {
        if (songs != (TrackInfo *)0x0) {
          FoundXMID((XMISong *)((ulong)chunk[(long)iVar5 + 5] << 0x10),chunk + (long)iVar5 + 0xc,
                    uVar6 - 4,songs + iVar4);
        }
        iVar4 = iVar4 + 1;
      }
      iVar5 = iVar5 + (bVar2 & 1) + uVar6 + 8;
      if ((int)((uint)bVar1 << 0x18) < 0) {
        iVar5 = len;
      }
    } while (iVar5 <= len + -0xc);
  }
  return iVar4;
}

Assistant:

int XMISong::FindXMIDforms(const BYTE *chunk, int len, TrackInfo *songs) const
{
	int count = 0;

	for (int p = 0; p <= len - 12; )
	{
		int chunktype = GetNativeInt(chunk + p);
		int chunklen = GetBigInt(chunk + p + 4);

		if (chunktype == MAKE_ID('F','O','R','M'))
		{
			if (GetNativeInt(chunk + p + 8) == MAKE_ID('X','M','I','D'))
			{
				if (songs != NULL)
				{
					FoundXMID(chunk + p + 12, chunklen - 4, songs + count);
				}
				count++;
			}
		}
		else if (chunktype == MAKE_ID('C','A','T',' '))
		{
			// Recurse to handle CAT chunks.
			count += FindXMIDforms(chunk + p + 12, chunklen - 4, songs + count);
		}
		// IFF chunks are padded to even byte boundaries to avoid
		// unaligned reads on 68k processors.
		p += 8 + chunklen + (chunklen & 1);
		// Avoid crashes from corrupt chunks which indicate a negative size.
		if (chunklen < 0) p = len;
	}
	return count;
}